

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,StringPiece name)

{
  Tables *this_00;
  StringPiece name_00;
  _Alloc_hider _Var1;
  bool bVar2;
  long lVar3;
  size_type sVar4;
  Symbol SVar5;
  StringPiece key;
  StringPiece name_local;
  string prefix;
  string local_50 [32];
  
  name_local.length_ = name.length_;
  name_local.ptr_ = name.ptr_;
  stringpiece_internal::StringPiece::ToString_abi_cxx11_(&prefix,&name_local);
  do {
    lVar3 = std::__cxx11::string::rfind((char)&prefix,0x2e);
    if (lVar3 == -1) {
      if (this->underlay_ == (DescriptorPool *)0x0) {
        bVar2 = false;
      }
      else {
        name_00.length_ = name_local.length_;
        name_00.ptr_ = name_local.ptr_;
        bVar2 = IsSubSymbolOfBuiltType(this->underlay_,name_00);
      }
      goto LAB_0035968f;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)&prefix);
    std::__cxx11::string::operator=((string *)&prefix,local_50);
    std::__cxx11::string::~string(local_50);
    _Var1 = prefix._M_dataplus;
    this_00 = (this->tables_)._M_t.
              super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
              .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl
    ;
    sVar4 = stringpiece_internal::StringPiece::CheckSize(prefix._M_string_length);
    key.length_ = sVar4;
    key.ptr_ = _Var1._M_p;
    SVar5 = Tables::FindSymbol(this_00,key);
  } while (((SVar5.ptr_ == (SymbolBase *)0x0) || ((SVar5.ptr_)->symbol_type_ == '\0')) ||
          ((SVar5.ptr_)->symbol_type_ == '\t'));
  bVar2 = true;
LAB_0035968f:
  std::__cxx11::string::~string((string *)&prefix);
  return bVar2;
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(StringPiece name) const {
  auto prefix = std::string(name);
  for (;;) {
    std::string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == std::string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type() != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != nullptr) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}